

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalNinjaMultiGenerator>::GetGeneratorNames_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmGlobalGeneratorSimpleFactory<cmGlobalNinjaMultiGenerator> *this
          )

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5d [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  cmGlobalGeneratorSimpleFactory<cmGlobalNinjaMultiGenerator> *this_local;
  
  local_50 = &local_48;
  local_18 = (undefined1  [8])this;
  this_local = (cmGlobalGeneratorSimpleFactory<cmGlobalNinjaMultiGenerator> *)__return_storage_ptr__
  ;
  cmGlobalNinjaMultiGenerator::GetActualName_abi_cxx11_();
  local_28 = &local_48;
  local_20 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_5d);
  __l._M_len = local_20;
  __l._M_array = local_28;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,local_5d);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_5d);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28;
  do {
    local_80 = local_80 + -1;
    std::__cxx11::string::~string((string *)local_80);
  } while (local_80 != &local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> GetGeneratorNames() const override
  {
    return { T::GetActualName() };
  }